

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.c++
# Opt level: O1

void __thiscall kj::Exception::truncateCommonTrace(Exception *this)

{
  uint in_ECX;
  uint uVar1;
  ulong uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  ArrayPtr<void_*const> AVar7;
  void *refTraceSpace [36];
  kj akStack_148 [288];
  
  if (this->traceCount != 0) {
    AVar7 = getStackTrace(akStack_148,(ArrayPtr<void_*>)ZEXT816(0x24),in_ECX);
    uVar3 = (uint)AVar7.size_;
    if (uVar3 != 0) {
      uVar1 = this->traceCount - 1;
      uVar2 = AVar7.size_ & 0xffffffff;
      do {
        uVar3 = uVar3 - 1;
        if (AVar7.ptr[uVar2 - 1] == this->trace[uVar1]) {
          uVar6 = 0;
          uVar4 = uVar1;
          uVar5 = uVar3;
          do {
            if (uVar6 == this->traceCount) {
              uVar4 = 0;
LAB_001fdcc0:
              this->traceCount = uVar4;
              return;
            }
            if (AVar7.ptr[uVar5] != this->trace[uVar4] && AVar7.size_ >> 1 < uVar6)
            goto LAB_001fdcc0;
            uVar6 = uVar6 + 1;
            uVar4 = uVar4 - 1;
            uVar5 = uVar5 - 1;
          } while (uVar2 != uVar6);
        }
        uVar2 = uVar2 - 1;
      } while (uVar2 != 0);
    }
  }
  return;
}

Assistant:

void Exception::truncateCommonTrace() {
  if (traceCount > 0) {
    // Create a "reference" stack trace that is a little bit deeper than the one in the exception.
    void* refTraceSpace[sizeof(this->trace) / sizeof(this->trace[0]) + 4];
    auto refTrace = kj::getStackTrace(refTraceSpace, 0);

    // We expect that the deepest frame in the exception's stack trace should be somewhere in our
    // own trace, since our own trace has a deeper limit. Search for it.
    for (uint i = refTrace.size(); i > 0; i--) {
      if (refTrace[i-1] == trace[traceCount-1]) {
        // See how many frames match.
        for (uint j = 0; j < i; j++) {
          if (j >= traceCount) {
            // We matched the whole trace, apparently?
            traceCount = 0;
            return;
          } else if (refTrace[i-j-1] != trace[traceCount-j-1]) {
            // Found mismatching entry.

            // If we matched more than half of the reference trace, guess that this is in fact
            // the prefix we're looking for.
            if (j > refTrace.size() / 2) {
              // Delete the matching suffix. Also delete one non-matched entry on the assumption
              // that both traces contain that stack frame but are simply at different points in
              // the function.
              traceCount -= j + 1;
              return;
            }
          }
        }
      }
    }

    // No match. Ignore.
  }
}